

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeMerging.cpp
# Opt level: O3

bool __thiscall wasm::anon_unknown_0::TypeMerging::merge(TypeMerging *this,MergeKind kind)

{
  pointer *this_00;
  TypeUpdates *this_01;
  vector<wasm::HeapType,std::allocator<wasm::HeapType>> *this_02;
  pointer pFVar1;
  long lVar2;
  _Hash_node_base *p_Var3;
  _Hash_node_base *p_Var4;
  pointer pHVar5;
  iterator __position;
  _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_std::optional<wasm::HeapType>,_std::unordered_map<wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>,_wasm::(anonymous_namespace)::ShapeHash,_wasm::(anonymous_namespace)::ShapeEq,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>_>_>_>,_true>_>_>
  *p_Var6;
  _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_std::optional<wasm::HeapType>,_std::unordered_map<wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>,_wasm::(anonymous_namespace)::ShapeHash,_wasm::(anonymous_namespace)::ShapeEq,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>_>_>_>,_true>_>_>
  *this_03;
  _Storage<wasm::HeapType,_true> _Var7;
  __buckets_ptr pp_Var8;
  __node_base_ptr p_Var9;
  _Storage<wasm::HeapType,_true> _Var10;
  bool bVar11;
  Shareability SVar12;
  HeapTypeKind HVar13;
  CastTypes *this_04;
  const_iterator cVar14;
  size_t sVar15;
  size_t *__s;
  size_t *psVar16;
  iterator iVar17;
  mapped_type *pmVar18;
  undefined4 extraout_var;
  size_t sVar19;
  Struct *pSVar20;
  pointer pFVar21;
  _Hash_node_base *p_Var22;
  _Hash_node_base *p_Var23;
  _List_node_base *p_Var24;
  iterator iVar25;
  uint *puVar26;
  mapped_type *pmVar27;
  undefined1 uVar28;
  _Hash_node_base _Var29;
  pointer p_Var30;
  undefined8 extraout_RDX;
  ulong uVar31;
  __buckets_ptr __n;
  ulong uVar32;
  _Hash_node_base *p_Var33;
  ulong uVar34;
  _Hash_node_base *p_Var35;
  __node_ptr __n_00;
  pointer pvVar36;
  char *msg;
  uint uVar37;
  long lVar38;
  undefined1 auVar39 [8];
  pointer pHVar40;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *partition;
  _Hash_node_base *p_Var41;
  _Storage<wasm::HeapType,_true> _Var42;
  HeapType HVar43;
  _Optional_payload_base<wasm::HeapType> _Var44;
  undefined1 auVar45 [16];
  Signature SVar46;
  optional<wasm::HeapType> oVar47;
  initializer_list<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_> __l;
  initializer_list<wasm::HeapType> __l_00;
  undefined1 local_258 [8];
  unordered_map<wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>_>_>
  typePartitions;
  optional<wasm::HeapType> super_1;
  undefined1 local_1f8 [8];
  Partitions partitions;
  anon_class_24_3_64d2c6ff ensurePartition;
  vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
  newPartitions;
  unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
  partitionIndices;
  vector<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>,_std::allocator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>
  dfa;
  HeapType local_158;
  HeapType type_1;
  undefined1 auStack_148 [8];
  vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
  split;
  long local_120;
  size_t *local_118;
  unordered_map<std::optional<wasm::HeapType>,_std::unordered_map<wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>,_wasm::(anonymous_namespace)::ShapeHash,_wasm::(anonymous_namespace)::ShapeEq,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>_>_>,_std::hash<std::optional<wasm::HeapType>_>,_std::equal_to<std::optional<wasm::HeapType>_>,_std::allocator<std::pair<const_std::optional<wasm::HeapType>,_std::unordered_map<wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>,_wasm::(anonymous_namespace)::ShapeHash,_wasm::(anonymous_namespace)::ShapeEq,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>_>_>_>_>_>
  shapePartitions;
  _Hash_node_base *local_d0;
  undefined1 local_c8 [8];
  vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
  refinedPartitions;
  undefined1 auStack_a8 [8];
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> newMergeable;
  allocator_type local_69;
  TypeMerging *local_68;
  _Hash_node_base *local_60;
  pointer __ptr_2;
  optional<wasm::HeapType> super;
  
  local_1f8 = (undefined1  [8])local_1f8;
  partitions.
  super__List_base<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>,_std::allocator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
  local_258 = (undefined1  [8])&typePartitions._M_h._M_rehash_policy._M_next_resize;
  typePartitions._M_h._M_buckets = (__buckets_ptr)0x1;
  typePartitions._M_h._M_bucket_count = 0;
  typePartitions._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  typePartitions._M_h._M_element_count._0_4_ = 0x3f800000;
  typePartitions._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  typePartitions._M_h._M_rehash_policy._4_4_ = 0;
  typePartitions._M_h._M_rehash_policy._M_next_resize = 0;
  local_118 = &shapePartitions._M_h._M_rehash_policy._M_next_resize;
  shapePartitions._M_h._M_buckets = (__buckets_ptr)0x1;
  shapePartitions._M_h._M_bucket_count = 0;
  shapePartitions._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  shapePartitions._M_h._M_element_count._0_4_ = 0x3f800000;
  shapePartitions._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  shapePartitions._M_h._M_rehash_policy._4_4_ = 0;
  shapePartitions._M_h._M_rehash_policy._M_next_resize = 0;
  partitions.
  super__List_base<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>,_std::allocator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>
  ._M_impl._M_node._M_size = (size_t)local_258;
  partitions.
  super__List_base<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>,_std::allocator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)local_1f8;
  ensurePartition.typePartitions =
       (unordered_map<wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>_>_>
        *)local_1f8;
  ensurePartition.partitions = (Partitions *)this;
  local_68 = this;
  mergeableSupertypesFirst
            ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
             &newPartitions.
              super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,this,&this->mergeable);
  pp_Var8 = partitionIndices._M_h._M_buckets;
  if (newPartitions.
      super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage !=
      (pointer)partitionIndices._M_h._M_buckets) {
    refinedPartitions.
    super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&local_68->privateTypes;
    this_04 = &local_68->castTypes;
    pvVar36 = newPartitions.
              super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
    do {
      split.
      super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)(pvVar36->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
                    _M_impl.super__Vector_impl_data._M_start;
      __ptr_2 = (pointer)0x0;
      super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_payload = (_Storage<wasm::HeapType,_true>)0x0;
      super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_engaged = false;
      super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._9_7_ = 0;
      type_1.id = (uintptr_t)pvVar36;
      local_c8 = (undefined1  [8])
                 split.
                 super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      HeapType::getHeapTypeChildren
                ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_a8,
                 (HeapType *)
                 &split.
                  super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      pHVar40 = newMergeable.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                _M_impl.super__Vector_impl_data._M_start;
      for (auVar39 = auStack_a8; auVar39 != (undefined1  [8])pHVar40;
          auVar39 = (undefined1  [8])((long)auVar39 + 8)) {
        partitionIndices._M_h._M_single_bucket = (__node_base_ptr)((pointer)auVar39)->id;
        if (((__node_base_ptr)0x7c < partitionIndices._M_h._M_single_bucket) &&
           (cVar14 = std::
                     _Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     ::find((_Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                             *)refinedPartitions.
                               super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                            (key_type *)&partitionIndices._M_h._M_single_bucket),
           cVar14.super__Node_iterator_base<wasm::HeapType,_true>._M_cur == (__node_type *)0x0)) {
          if (super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
              super__Optional_payload_base<wasm::HeapType>._M_payload ==
              (_Storage<wasm::HeapType,_true>)
              super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
              super__Optional_payload_base<wasm::HeapType>._8_8_) {
            std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>::
            _M_realloc_insert<wasm::HeapType_const&>
                      ((vector<wasm::HeapType,std::allocator<wasm::HeapType>> *)&__ptr_2,
                       (iterator)
                       super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                       super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id,
                       (HeapType *)&partitionIndices._M_h._M_single_bucket);
          }
          else {
            *(__node_base_ptr *)
             super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::HeapType>._M_payload =
                 partitionIndices._M_h._M_single_bucket;
            super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::HeapType>._M_payload =
                 (_Storage<wasm::HeapType,_true>)
                 ((long)super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                        super__Optional_payload_base<wasm::HeapType>._M_payload + 8);
          }
        }
      }
      _Var42 = (_Storage<wasm::HeapType,_true>)__ptr_2;
      _Var7 = super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
              super__Optional_payload_base<wasm::HeapType>._M_payload;
      if (auStack_a8 != (undefined1  [8])0x0) {
        operator_delete((void *)auStack_a8,
                        (long)newMergeable.
                              super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)auStack_a8);
        _Var42 = (_Storage<wasm::HeapType,_true>)__ptr_2;
        _Var7 = super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::HeapType>._M_payload;
      }
      for (; _Var10 = super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                      super__Optional_payload_base<wasm::HeapType>._M_payload,
          _Var42 != super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                    super__Optional_payload_base<wasm::HeapType>._M_payload;
          _Var42 = (_Storage<wasm::HeapType,_true>)((long)_Var42 + 8)) {
        super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::HeapType>._M_payload = _Var7;
        merge::anon_class_24_3_64d2c6ff::operator()
                  ((anon_class_24_3_64d2c6ff *)
                   &partitions.
                    super__List_base<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>,_std::allocator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>
                    ._M_impl._M_node._M_size,(HeapType)*(uintptr_t *)_Var42);
        _Var7 = super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::HeapType>._M_payload;
        super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::HeapType>._M_payload = _Var10;
      }
      super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_payload = _Var7;
      if ((_Storage<wasm::HeapType,_true>)__ptr_2 != (_Storage<wasm::HeapType,_true>)0x0) {
        operator_delete(__ptr_2,super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                                super__Optional_payload_base<wasm::HeapType>._8_8_ - (long)__ptr_2);
      }
      sVar15 = SmallSetBase<wasm::HeapType,_5UL,_wasm::UnorderedFixedStorage<wasm::HeapType,_5UL>,_std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>_>
               ::count(&this_04->
                        super_SmallSetBase<wasm::HeapType,_5UL,_wasm::UnorderedFixedStorage<wasm::HeapType,_5UL>,_std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>_>
                       ,(HeapType *)local_c8);
      if ((sVar15 != 0) ||
         (cVar14 = std::
                   _Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   ::find((_Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                           *)refinedPartitions.
                             super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,(key_type *)local_c8
                         ),
         cVar14.super__Node_iterator_base<wasm::HeapType,_true>._M_cur == (__node_type *)0x0)) {
        merge::anon_class_24_3_64d2c6ff::operator()
                  ((anon_class_24_3_64d2c6ff *)
                   &partitions.
                    super__List_base<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>,_std::allocator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>
                    ._M_impl._M_node._M_size,(HeapType)local_c8);
        goto LAB_00ad1c5b;
      }
      if (kind == Supertypes) {
        oVar47 = HeapType::getDeclaredSuperType((HeapType *)local_c8);
        if ((((undefined1  [16])
              oVar47.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
              super__Optional_payload_base<wasm::HeapType> & (undefined1  [16])0x1) ==
             (undefined1  [16])0x0) ||
           (bVar11 = shapeEq((HeapType)local_c8,
                             oVar47.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                             super__Optional_payload_base<wasm::HeapType>._M_payload._M_value),
           !bVar11)) {
          merge::anon_class_24_3_64d2c6ff::operator()
                    ((anon_class_24_3_64d2c6ff *)
                     &partitions.
                      super__List_base<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>,_std::allocator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>
                      ._M_impl._M_node._M_size,(HeapType)local_c8);
          goto LAB_00ad1c5b;
        }
        iVar17 = merge::anon_class_24_3_64d2c6ff::operator()
                           ((anon_class_24_3_64d2c6ff *)
                            &partitions.
                             super__List_base<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>,_std::allocator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>
                             ._M_impl._M_node._M_size,
                            oVar47.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                            super__Optional_payload_base<wasm::HeapType>._M_payload._M_value);
        makeDFAState((State<wasm::HeapType> *)auStack_a8,local_68,(HeapType)local_c8);
        std::
        vector<wasm::DFA::State<wasm::HeapType>,std::allocator<wasm::DFA::State<wasm::HeapType>>>::
        emplace_back<wasm::DFA::State<wasm::HeapType>>
                  ((vector<wasm::DFA::State<wasm::HeapType>,std::allocator<wasm::DFA::State<wasm::HeapType>>>
                    *)(iVar17._M_node + 1),(State<wasm::HeapType> *)auStack_a8);
        if (newMergeable.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl
            .super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(newMergeable.
                          super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)newMergeable.
                                super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)newMergeable.
                                super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        pmVar18 = std::__detail::
                  _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)local_258,(key_type *)local_c8);
        goto LAB_00ad24b6;
      }
      partitionIndices._M_h._M_single_bucket = (__node_base_ptr)local_c8;
      _Var44 = (_Optional_payload_base<wasm::HeapType>)
               HeapType::getDeclaredSuperType((HeapType *)&partitionIndices._M_h._M_single_bucket);
      __ptr_2 = (pointer)_Var44._M_payload;
      uVar31 = _Var44._8_8_ & 0xffffffff;
      super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id._0_1_ = _Var44._M_engaged;
      if (((undefined1  [16])_Var44 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        __ptr_2 = (pointer)getMerged(local_68,(HeapType)__ptr_2);
        _Var44._8_8_ = extraout_RDX;
        _Var44._M_payload._M_value.id = (HeapType)(HeapType)__ptr_2;
        uVar31 = (ulong)super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                        super__Optional_payload_base<wasm::HeapType>._M_payload & 0xff;
        if (super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id._0_1_ == '\0') {
          super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id._0_1_ = 1;
          uVar31 = 1;
        }
      }
      p_Var33 = (_Hash_node_base *)0xfffffffffffff2fb;
      _Var42 = _Var44._M_payload;
      uVar28 = (byte)uVar31;
      if ((uVar31 & 1) != 0) {
        p_Var33 = (_Hash_node_base *)
                  std::hash<wasm::HeapType>::operator()
                            ((hash<wasm::HeapType> *)auStack_a8,(HeapType *)&__ptr_2);
        _Var42 = (_Storage<wasm::HeapType,_true>)__ptr_2;
        uVar28 = super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                 super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id._0_1_;
      }
      uVar31 = (ulong)p_Var33 % (ulong)shapePartitions._M_h._M_buckets;
      if ((_Hash_node_base *)local_118[uVar31] != (_Hash_node_base *)0x0) {
        local_d0 = ((_Hash_node_base *)local_118[uVar31])->_M_nxt;
        p_Var41 = local_d0[10]._M_nxt;
        do {
          if (p_Var41 == p_Var33) {
            if ((*(byte *)&local_d0[2]._M_nxt == uVar28) && ((uVar28 & 1) != 0)) {
              if (*(_Storage<wasm::HeapType,_true> *)(local_d0 + 1) == _Var42) goto LAB_00ad1fe4;
            }
            else if (*(byte *)&local_d0[2]._M_nxt == uVar28) goto LAB_00ad1fe4;
          }
          local_d0 = local_d0->_M_nxt;
        } while ((local_d0 != (_Hash_node_base *)0x0) &&
                (p_Var41 = local_d0[10]._M_nxt,
                (ulong)p_Var41 % (ulong)shapePartitions._M_h._M_buckets == uVar31));
      }
      local_d0 = (_Hash_node_base *)operator_new(0x58);
      local_d0->_M_nxt = (_Hash_node_base *)0x0;
      local_d0[1]._M_nxt = &__ptr_2->super__Hash_node_base;
      *(_Storage<wasm::HeapType,_true> *)(local_d0 + 2) =
           super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::HeapType>._M_payload;
      local_d0[7]._M_nxt = (_Hash_node_base *)0x0;
      local_d0[3]._M_nxt = local_d0 + 9;
      local_d0[4]._M_nxt = (_Hash_node_base *)0x1;
      local_d0[5]._M_nxt = (_Hash_node_base *)0x0;
      local_d0[6]._M_nxt = (_Hash_node_base *)0x0;
      *(undefined4 *)&local_d0[7]._M_nxt = 0x3f800000;
      local_d0[8]._M_nxt = (_Hash_node_base *)0x0;
      local_d0[9]._M_nxt = (_Hash_node_base *)0x0;
      local_60 = p_Var33;
      auVar45 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                          ((ulong)&shapePartitions._M_h._M_element_count,
                           (ulong)shapePartitions._M_h._M_buckets,
                           (ulong)shapePartitions._M_h._M_before_begin._M_nxt);
      __n = auVar45._8_8_;
      if ((auVar45 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        if (__n == (__buckets_ptr)0x1) {
          shapePartitions._M_h._M_rehash_policy._M_next_resize = 0;
          __s = &shapePartitions._M_h._M_rehash_policy._M_next_resize;
        }
        else {
          __s = (size_t *)
                __gnu_cxx::new_allocator<std::__detail::_Hash_node_base_*>::allocate
                          ((new_allocator<std::__detail::_Hash_node_base_*> *)auStack_a8,
                           (size_type)__n,(void *)0x0);
          memset(__s,0,(long)__n * 8);
        }
        _Var29._M_nxt = (_Hash_node_base *)shapePartitions._M_h._M_bucket_count;
        shapePartitions._M_h._M_bucket_count = 0;
        if (_Var29._M_nxt != (_Hash_node_base *)0x0) {
          uVar31 = 0;
          do {
            p_Var33 = (_Var29._M_nxt)->_M_nxt;
            uVar32 = (ulong)_Var29._M_nxt[10]._M_nxt % (ulong)__n;
            if ((_Hash_node_base *)__s[uVar32] == (_Hash_node_base *)0x0) {
              (_Var29._M_nxt)->_M_nxt = (_Hash_node_base *)shapePartitions._M_h._M_bucket_count;
              shapePartitions._M_h._M_bucket_count = (size_type)_Var29._M_nxt;
              __s[uVar32] = (size_t)&shapePartitions._M_h._M_bucket_count;
              if ((_Var29._M_nxt)->_M_nxt != (_Hash_node_base *)0x0) {
                psVar16 = __s + uVar31;
                goto LAB_00ad1e80;
              }
            }
            else {
              (_Var29._M_nxt)->_M_nxt = ((_Hash_node_base *)__s[uVar32])->_M_nxt;
              psVar16 = (size_t *)__s[uVar32];
              uVar32 = uVar31;
LAB_00ad1e80:
              *psVar16 = (size_t)_Var29._M_nxt;
            }
            _Var29._M_nxt = p_Var33;
            uVar31 = uVar32;
          } while (p_Var33 != (_Hash_node_base *)0x0);
        }
        if (&shapePartitions._M_h._M_rehash_policy._M_next_resize != local_118) {
          operator_delete(local_118,(long)shapePartitions._M_h._M_buckets << 3);
        }
        shapePartitions._M_h._M_buckets = __n;
        uVar31 = (ulong)local_60 % (ulong)__n;
        local_118 = __s;
      }
      local_d0[10]._M_nxt = local_60;
      if ((_Hash_node_base *)local_118[uVar31] == (_Hash_node_base *)0x0) {
        local_d0->_M_nxt = (_Hash_node_base *)shapePartitions._M_h._M_bucket_count;
        if (shapePartitions._M_h._M_bucket_count != 0) {
          local_118[*(ulong *)(shapePartitions._M_h._M_bucket_count + 0x50) %
                    (ulong)shapePartitions._M_h._M_buckets] = (size_t)local_d0;
        }
        local_118[uVar31] = (size_t)&shapePartitions._M_h._M_bucket_count;
        shapePartitions._M_h._M_bucket_count = (size_type)local_d0;
      }
      else {
        local_d0->_M_nxt = ((_Hash_node_base *)local_118[uVar31])->_M_nxt;
        ((_Hash_node_base *)local_118[uVar31])->_M_nxt = local_d0;
      }
      shapePartitions._M_h._M_before_begin._M_nxt =
           (_Hash_node_base *)((long)&(shapePartitions._M_h._M_before_begin._M_nxt)->_M_nxt + 1);
LAB_00ad1fe4:
      p_Var9 = partitionIndices._M_h._M_single_bucket;
      local_60 = (_Hash_node_base *)operator_new(0x20);
      local_60->_M_nxt = (_Hash_node_base *)0x0;
      local_60[1]._M_nxt = p_Var9;
      local_60[2]._M_nxt = (_Hash_node_base *)local_1f8;
      split.
      super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)p_Var9;
      bVar11 = HeapType::isOpen((HeapType *)
                                &split.
                                 super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
      SVar12 = HeapType::getShared((HeapType *)
                                   &split.
                                    super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      HVar13 = HeapType::getKind((HeapType *)
                                 &split.
                                  super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      shapePartitions._M_h._M_single_bucket = (__node_base_ptr)CONCAT44(extraout_var,HVar13);
      switch(HVar13) {
      case Func:
        SVar46 = HeapType::getSignature
                           ((HeapType *)
                            &split.
                             super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
        sVar15 = shapeHash(SVar46.params.id);
        sVar19 = shapeHash(SVar46.results.id);
        uVar31 = (sVar15 >> 4) + sVar19 + sVar15 * 0x1000 + -0x61c8864680b583eb ^ sVar15;
        break;
      case Struct:
        pSVar20 = HeapType::getStruct((HeapType *)
                                      &split.
                                       super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
        pFVar21 = (pSVar20->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pFVar1 = (pSVar20->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        uVar31 = (long)pFVar1 - (long)pFVar21 >> 4;
        if (pFVar1 != pFVar21) {
          lVar38 = 8;
          uVar32 = 0;
          do {
            lVar2 = *(long *)((long)&(pFVar21->type).id + lVar38);
            sVar15 = shapeHash((Type)*(uintptr_t *)((long)pFVar21 + lVar38 + -8));
            uVar34 = (ulong)(int)lVar2;
            uVar34 = (uVar34 >> 4) + uVar34 * 0x1000 + (lVar2 >> 0x20) + -0x61c8864680b583eb ^
                     uVar34;
            uVar31 = uVar31 ^ uVar31 * 0x1000 + -0x61c8864680b583eb + (uVar31 >> 4) +
                              (sVar15 + 0x9e3779b97f4a7c15 + uVar34 * 0x1000 + (uVar34 >> 4) ^
                              uVar34);
            uVar32 = uVar32 + 1;
            pFVar21 = (pSVar20->fields).
                      super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                      super__Vector_impl_data._M_start;
            lVar38 = lVar38 + 0x10;
          } while (uVar32 < (ulong)((long)(pSVar20->fields).
                                          super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar21
                                   >> 4));
        }
        break;
      case Array:
        HeapType::getArray((HeapType *)auStack_a8);
        pHVar40 = newMergeable.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        sVar15 = shapeHash((Type)auStack_a8);
        uVar31 = (ulong)(int)pHVar40;
        uVar31 = (uVar31 >> 4) + uVar31 * 0x1000 + ((long)pHVar40 >> 0x20) + -0x61c8864680b583eb ^
                 uVar31;
        uVar31 = sVar15 + 0x9e3779b97f4a7c15 + uVar31 * 0x1000 + (uVar31 >> 4) ^ uVar31;
        break;
      case Cont:
        uVar37 = 0x255;
        msg = "TODO: cont";
        goto LAB_00ad2ab7;
      default:
        uVar37 = 0x259;
        msg = "unexpected kind";
LAB_00ad2ab7:
        handle_unreachable(msg,
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/TypeMerging.cpp"
                           ,uVar37);
      }
      lVar38 = -0x61c8864680b583ea;
      if (SVar12 != Shared) {
        lVar38 = -0x61c8864680b583eb;
      }
      uVar34 = (ulong)bVar11 * 0x1000 + lVar38;
      uVar32 = bVar11 ^ uVar34;
      uVar32 = (uVar34 >> 4) + 0x9e3779b97f4a7c15 + uVar32 * 0x1000 +
               (long)(int)shapePartitions._M_h._M_single_bucket ^ uVar32;
      p_Var41 = (_Hash_node_base *)
                (uVar32 * 0x1000 + -0x61c8864680b583eb + (uVar32 >> 4) + uVar31 ^ uVar32);
      uVar31 = (ulong)p_Var41 % (ulong)local_d0[4]._M_nxt;
      p_Var33 = local_d0[3]._M_nxt[uVar31]._M_nxt;
      if (p_Var33 != (_Hash_node_base *)0x0) {
        p_Var22 = p_Var33->_M_nxt[3]._M_nxt;
        p_Var35 = p_Var33->_M_nxt;
        while ((p_Var22 != p_Var41 ||
               (bVar11 = shapeEq((HeapType)local_60[1]._M_nxt,(HeapType)p_Var35[1]._M_nxt), !bVar11)
               )) {
          p_Var3 = p_Var35->_M_nxt;
          if ((p_Var3 == (_Hash_node_base *)0x0) ||
             (p_Var22 = p_Var3[3]._M_nxt, p_Var33 = p_Var35, p_Var35 = p_Var3,
             (ulong)p_Var22 % (ulong)local_d0[4]._M_nxt != uVar31)) goto LAB_00ad22b6;
        }
        p_Var33 = p_Var33->_M_nxt;
        if (p_Var33 != (_Hash_node_base *)0x0) {
          operator_delete(local_60,0x20);
          goto LAB_00ad2465;
        }
      }
LAB_00ad22b6:
      shapePartitions._M_h._M_single_bucket = local_d0[8]._M_nxt;
      auVar45 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                          ((ulong)(local_d0 + 7),(ulong)local_d0[4]._M_nxt,(ulong)local_d0[6]._M_nxt
                          );
      p_Var33 = auVar45._8_8_;
      if ((auVar45 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        p_Var22 = local_d0[3]._M_nxt;
      }
      else {
        if (p_Var33 == (_Hash_node_base *)0x1) {
          p_Var22 = local_d0 + 9;
          local_d0[9]._M_nxt = (_Hash_node_base *)0x0;
        }
        else {
          p_Var22 = (_Hash_node_base *)
                    __gnu_cxx::new_allocator<std::__detail::_Hash_node_base_*>::allocate
                              ((new_allocator<std::__detail::_Hash_node_base_*> *)auStack_a8,
                               (size_type)p_Var33,(void *)0x0);
          memset(p_Var22,0,(long)p_Var33 * 8);
        }
        p_Var35 = local_d0[5]._M_nxt;
        local_d0[5]._M_nxt = (_Hash_node_base *)0x0;
        if (p_Var35 != (_Hash_node_base *)0x0) {
          p_Var3 = local_d0 + 5;
          uVar31 = 0;
          do {
            p_Var4 = p_Var35->_M_nxt;
            uVar32 = (ulong)p_Var35[3]._M_nxt % (ulong)p_Var33;
            if (p_Var22[uVar32]._M_nxt == (_Hash_node_base *)0x0) {
              p_Var35->_M_nxt = p_Var3->_M_nxt;
              p_Var3->_M_nxt = p_Var35;
              p_Var22[uVar32]._M_nxt = p_Var3;
              if (p_Var35->_M_nxt != (_Hash_node_base *)0x0) {
                p_Var23 = p_Var22 + uVar31;
                goto LAB_00ad2365;
              }
            }
            else {
              p_Var35->_M_nxt = (p_Var22[uVar32]._M_nxt)->_M_nxt;
              p_Var23 = p_Var22[uVar32]._M_nxt;
              uVar32 = uVar31;
LAB_00ad2365:
              p_Var23->_M_nxt = p_Var35;
            }
            p_Var35 = p_Var4;
            uVar31 = uVar32;
          } while (p_Var4 != (_Hash_node_base *)0x0);
        }
        if (local_d0 + 9 != local_d0[3]._M_nxt) {
          operator_delete(local_d0[3]._M_nxt,(long)local_d0[4]._M_nxt << 3);
        }
        local_d0[4]._M_nxt = p_Var33;
        local_d0[3]._M_nxt = p_Var22;
        uVar31 = (ulong)p_Var41 % (ulong)p_Var33;
      }
      p_Var33 = local_60;
      local_60[3]._M_nxt = p_Var41;
      if (p_Var22[uVar31]._M_nxt == (_Hash_node_base *)0x0) {
        p_Var41 = local_d0[5]._M_nxt;
        local_60->_M_nxt = p_Var41;
        local_d0[5]._M_nxt = local_60;
        if (p_Var41 != (_Hash_node_base *)0x0) {
          p_Var22[(ulong)p_Var41[3]._M_nxt % (ulong)local_d0[4]._M_nxt]._M_nxt = local_60;
          p_Var22 = local_d0[3]._M_nxt;
        }
        p_Var22[uVar31]._M_nxt = local_d0 + 5;
      }
      else {
        local_60->_M_nxt = (p_Var22[uVar31]._M_nxt)->_M_nxt;
        (p_Var22[uVar31]._M_nxt)->_M_nxt = local_60;
      }
      local_d0[6]._M_nxt = (_Hash_node_base *)((long)&(local_d0[6]._M_nxt)->_M_nxt + 1);
      auStack_a8 = (undefined1  [8])0x0;
      newMergeable.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      newMergeable.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      p_Var24 = (_List_node_base *)operator_new(0x28);
      p_Var24[1]._M_next = (_List_node_base *)0x0;
      p_Var24[1]._M_prev = (_List_node_base *)0x0;
      p_Var24[2]._M_next = (_List_node_base *)0x0;
      newMergeable.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      auStack_a8 = (undefined1  [8])0x0;
      newMergeable.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      std::__detail::_List_node_base::_M_hook(p_Var24);
      partitions.
      super__List_base<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>,_std::allocator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>
      ._M_impl._M_node.super__List_node_base._M_prev =
           (_List_node_base *)
           ((long)&(partitions.
                    super__List_base<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>,_std::allocator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>
                    ._M_impl._M_node.super__List_node_base._M_prev)->_M_next + 1);
      p_Var33[2]._M_nxt = (_Hash_node_base *)p_Var24;
      std::
      vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>::
      ~vector((vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>
               *)auStack_a8);
LAB_00ad2465:
      iVar17._M_node = (_List_node_base *)p_Var33[2]._M_nxt;
      makeDFAState((State<wasm::HeapType> *)auStack_a8,local_68,(HeapType)local_c8);
      std::vector<wasm::DFA::State<wasm::HeapType>,std::allocator<wasm::DFA::State<wasm::HeapType>>>
      ::emplace_back<wasm::DFA::State<wasm::HeapType>>
                ((vector<wasm::DFA::State<wasm::HeapType>,std::allocator<wasm::DFA::State<wasm::HeapType>>>
                  *)(iVar17._M_node + 1),(State<wasm::HeapType> *)auStack_a8);
      if (newMergeable.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(newMergeable.
                        super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)newMergeable.
                              super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)newMergeable.
                              super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      pmVar18 = std::__detail::
                _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)local_258,(key_type *)local_c8);
LAB_00ad24b6:
      pmVar18->_M_node = iVar17._M_node;
LAB_00ad1c5b:
      pvVar36 = (pointer)(type_1.id + 8);
    } while (pvVar36 != (pointer)pp_Var8);
  }
  if (newPartitions.
      super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(newPartitions.
                    super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                    partitionIndices._M_h._M_bucket_count -
                    (long)newPartitions.
                          super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  std::
  vector<std::vector<wasm::DFA::State<wasm::HeapType>,std::allocator<wasm::DFA::State<wasm::HeapType>>>,std::allocator<std::vector<wasm::DFA::State<wasm::HeapType>,std::allocator<wasm::DFA::State<wasm::HeapType>>>>>
  ::
  vector<std::move_iterator<std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,std::allocator<wasm::DFA::State<wasm::HeapType>>>>>,void>
            ((vector<std::vector<wasm::DFA::State<wasm::HeapType>,std::allocator<wasm::DFA::State<wasm::HeapType>>>,std::allocator<std::vector<wasm::DFA::State<wasm::HeapType>,std::allocator<wasm::DFA::State<wasm::HeapType>>>>>
              *)&partitionIndices._M_h._M_single_bucket,
             (move_iterator<std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>
              )local_1f8,
             (move_iterator<std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>
              )local_1f8,(allocator_type *)auStack_a8);
  DFA::refinePartitions<wasm::HeapType>
            ((vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
              *)local_c8,
             (vector<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>,_std::allocator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>
              *)&partitionIndices._M_h._M_single_bucket);
  if (kind == Supertypes) {
    ensurePartition.this = (TypeMerging *)0x0;
    newPartitions.
    super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    newPartitions.
    super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    if (local_c8 !=
        (undefined1  [8])
        refinedPartitions.
        super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      type_1.id = (uintptr_t)
                  refinedPartitions.
                  super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      auVar39 = local_c8;
      HVar43.id = (uintptr_t)
                  refinedPartitions.
                  super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      do {
        pHVar40 = (((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auVar39)->
                  super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        pHVar5 = (((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auVar39)->
                 super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        if ((long)pHVar5 - (long)pHVar40 == 8) {
          std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
                    ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_a8,
                     (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auVar39);
          __l._M_len = 1;
          __l._M_array = (iterator)auStack_a8;
          std::
          vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
          ::vector((vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                    *)auStack_148,__l,
                   (allocator_type *)
                   &newPartitions.
                    super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (auStack_a8 != (undefined1  [8])0x0) {
            operator_delete((void *)auStack_a8,
                            (long)newMergeable.
                                  super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_a8);
          }
        }
        else {
          std::
          _Hashtable<wasm::HeapType,wasm::HeapType,std::allocator<wasm::HeapType>,std::__detail::_Identity,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
          ::
          _Hashtable<__gnu_cxx::__normal_iterator<wasm::HeapType_const*,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>>
                    ((_Hashtable<wasm::HeapType,wasm::HeapType,std::allocator<wasm::HeapType>,std::__detail::_Identity,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                      *)auStack_a8,pHVar40,pHVar5,0,
                     &newPartitions.
                      super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&__ptr_2,
                     &split.
                      super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          auStack_148 = (undefined1  [8])0x0;
          split.
          super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          split.
          super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          newPartitions.
          super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)&partitionIndices._M_h._M_rehash_policy._M_next_resize;
          partitionIndices._M_h._M_buckets = (__buckets_ptr)0x1;
          partitionIndices._M_h._M_bucket_count = 0;
          partitionIndices._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          partitionIndices._M_h._M_element_count._0_4_ = 0x3f800000;
          partitionIndices._M_h._M_rehash_policy._M_max_load_factor = 0.0;
          partitionIndices._M_h._M_rehash_policy._4_4_ = 0;
          partitionIndices._M_h._M_rehash_policy._M_next_resize = 0;
          refinedPartitions.
          super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)auVar39;
          mergeableSupertypesFirst
                    ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&__ptr_2,local_68,
                     (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auVar39);
          _Var7 = super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                  super__Optional_payload_base<wasm::HeapType>._M_payload;
          for (_Var42 = (_Storage<wasm::HeapType,_true>)__ptr_2; _Var42 != _Var7;
              _Var42 = (_Storage<wasm::HeapType,_true>)((long)_Var42 + 8)) {
            local_158.id = *(uintptr_t *)_Var42;
            oVar47 = HeapType::getDeclaredSuperType(&local_158);
            typePartitions._M_h._M_single_bucket =
                 oVar47.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                 super__Optional_payload_base<wasm::HeapType>._M_payload;
            super_1.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id._0_1_ =
                 oVar47.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                 super__Optional_payload_base<wasm::HeapType>._M_engaged;
            if ((((undefined1  [16])
                  oVar47.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                  super__Optional_payload_base<wasm::HeapType> & (undefined1  [16])0x1) ==
                 (undefined1  [16])0x0) ||
               (cVar14 = std::
                         _Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                         ::find((_Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                                 *)auStack_a8,(key_type *)&typePartitions._M_h._M_single_bucket),
               cVar14.super__Node_iterator_base<wasm::HeapType,_true>._M_cur == (__node_type *)0x0))
            {
              lVar38 = (long)split.
                             super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start - (long)auStack_148;
              super_1.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
              super__Optional_payload_base<wasm::HeapType>._8_8_ = local_158.id;
              this_00 = &split.
                         super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
              __l_00._M_len = 1;
              __l_00._M_array =
                   (iterator)
                   &super_1.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                    super__Optional_payload_base<wasm::HeapType>._M_engaged;
              std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
                        ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)this_00,__l_00,
                         &local_69);
              std::
              vector<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>,std::allocator<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>>
              ::emplace_back<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
                        ((vector<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>,std::allocator<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>>
                          *)auStack_148,
                         (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)this_00);
              if (split.
                  super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
                operator_delete(split.
                                super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                local_120 -
                                (long)split.
                                      super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
              }
              puVar26 = std::__detail::
                        _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                      *)&newPartitions.
                                         super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                     &local_158);
              uVar37 = (int)(lVar38 >> 3) * -0x55555555;
            }
            else {
              iVar25 = std::
                       _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       ::find((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                               *)&newPartitions.
                                  super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              (key_type *)&typePartitions._M_h._M_single_bucket);
              if (iVar25.
                  super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>.
                  _M_cur == (__node_type *)0x0) {
                std::__throw_out_of_range("_Map_base::at");
              }
              uVar37 = *(uint *)((long)iVar25.
                                       super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>
                                       ._M_cur + 0x10);
              this_02 = (vector<wasm::HeapType,std::allocator<wasm::HeapType>> *)
                        ((long)auStack_148 + (ulong)uVar37 * 0x18);
              __position._M_current = *(HeapType **)(this_02 + 8);
              if (__position._M_current == *(HeapType **)(this_02 + 0x10)) {
                std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>::
                _M_realloc_insert<wasm::HeapType_const&>(this_02,__position,&local_158);
              }
              else {
                (__position._M_current)->id = local_158.id;
                *(HeapType **)(this_02 + 8) = __position._M_current + 1;
              }
              puVar26 = std::__detail::
                        _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                      *)&newPartitions.
                                         super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                     &local_158);
            }
            *puVar26 = uVar37;
          }
          if (__ptr_2 != (pointer)0x0) {
            operator_delete(__ptr_2,super.super__Optional_base<wasm::HeapType,_true,_true>.
                                    _M_payload.super__Optional_payload_base<wasm::HeapType>._8_8_ -
                                    (long)__ptr_2);
          }
          std::
          _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)&newPartitions.
                            super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::
          _Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::~_Hashtable((_Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                         *)auStack_a8);
          auVar39 = (undefined1  [8])
                    refinedPartitions.
                    super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
          HVar43 = type_1;
        }
        std::
        vector<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>,std::allocator<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>>
        ::
        _M_range_insert<__gnu_cxx::__normal_iterator<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>*,std::vector<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>,std::allocator<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>>>>
                  ((vector<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>,std::allocator<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>>
                    *)&ensurePartition.this,
                   newPartitions.
                   super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,auStack_148);
        std::
        vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
        ::~vector((vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                   *)auStack_148);
        auVar39 = (undefined1  [8])((long)auVar39 + 0x18);
      } while (auVar39 != (undefined1  [8])HVar43.id);
    }
    std::
    vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
    ::operator=((vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                 *)local_c8,
                (vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                 *)&ensurePartition.this);
    std::
    vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
    ::~vector((vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
               *)&ensurePartition.this);
  }
  auStack_a8._0_4_ = 0;
  auStack_a8._4_4_ = 0;
  newMergeable.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0;
  newMergeable.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = 0;
  auStack_a8 = (undefined1  [8])0x0;
  newMergeable.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  newMergeable.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  refinedPartitions.
  super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       refinedPartitions.
       super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  if (local_c8 ==
      (undefined1  [8])
      refinedPartitions.
      super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    newMergeable.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    bVar11 = false;
  }
  else {
    this_01 = &local_68->merges;
    bVar11 = false;
    auVar39 = local_c8;
    do {
      mergeableSupertypesFirst
                ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                 &newPartitions.
                  super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,local_68,
                 (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auVar39);
      __ptr_2 = (pointer)((newPartitions.
                           super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                         super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
                         _M_impl.super__Vector_impl_data._M_start;
      operator_delete(newPartitions.
                      super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      partitionIndices._M_h._M_bucket_count -
                      (long)newPartitions.
                            super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (newMergeable.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
          super__Vector_impl_data._M_start ==
          newMergeable.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>::
        _M_realloc_insert<wasm::HeapType_const&>
                  ((vector<wasm::HeapType,std::allocator<wasm::HeapType>> *)auStack_a8,
                   (iterator)
                   newMergeable.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                   _M_impl.super__Vector_impl_data._M_start,(HeapType *)&__ptr_2);
      }
      else {
        (newMergeable.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
         super__Vector_impl_data._M_start)->id = (uintptr_t)__ptr_2;
        newMergeable.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
        super__Vector_impl_data._M_start =
             newMergeable.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
             _M_impl.super__Vector_impl_data._M_start + 1;
      }
      pHVar5 = (((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auVar39)->
               super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      p_Var30 = __ptr_2;
      for (pHVar40 = (((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auVar39)->
                     super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
                     super__Vector_impl_data._M_start; pHVar40 != pHVar5; pHVar40 = pHVar40 + 1) {
        newPartitions.
        super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pHVar40->id;
        if ((pointer)newPartitions.
                     super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage != p_Var30) {
          pmVar27 = std::__detail::
                    _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)this_01,
                                 (key_type *)
                                 &newPartitions.
                                  super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
          pmVar27->id = (uintptr_t)__ptr_2;
          bVar11 = true;
          p_Var30 = __ptr_2;
        }
      }
      auVar39 = (undefined1  [8])((long)auVar39 + 0x18);
    } while (auVar39 !=
             (undefined1  [8])
             refinedPartitions.
             super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage);
    auStack_a8._4_4_ = (undefined4)((ulong)auStack_a8 >> 0x20);
    newMergeable.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
    super__Vector_impl_data._M_start._4_4_ =
         (undefined4)
         ((ulong)newMergeable.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 0x20);
  }
  pHVar40 = (local_68->mergeable).
            super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
            super__Vector_impl_data._M_start;
  __n_00 = (__node_ptr)
           (local_68->mergeable).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  *(undefined4 *)
   &(local_68->mergeable).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
    _M_impl.super__Vector_impl_data._M_start = auStack_a8._0_4_;
  *(undefined4 *)
   ((long)&(local_68->mergeable).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
           ._M_impl.super__Vector_impl_data._M_start + 4) = auStack_a8._4_4_;
  *(undefined4 *)
   &(local_68->mergeable).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
    _M_impl.super__Vector_impl_data._M_finish =
       newMergeable.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  *(undefined4 *)
   ((long)&(local_68->mergeable).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) =
       newMergeable.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  (local_68->mergeable).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       newMergeable.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
       super__Vector_impl_data._M_finish;
  auStack_a8 = (undefined1  [8])0x0;
  newMergeable.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  newMergeable.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (pHVar40 != (pointer)0x0) {
    __n_00 = (__node_ptr)((long)__n_00 - (long)pHVar40);
    operator_delete(pHVar40,(ulong)__n_00);
    if (auStack_a8 != (undefined1  [8])0x0) {
      __n_00 = (__node_ptr)
               ((long)newMergeable.
                      super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)auStack_a8);
      operator_delete((void *)auStack_a8,(ulong)__n_00);
    }
  }
  std::
  vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
  ::~vector((vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
             *)local_c8);
  std::
  vector<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>,_std::allocator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>
  ::~vector((vector<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>,_std::allocator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>
             *)&partitionIndices._M_h._M_single_bucket);
  this_03 = (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_std::optional<wasm::HeapType>,_std::unordered_map<wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>,_wasm::(anonymous_namespace)::ShapeHash,_wasm::(anonymous_namespace)::ShapeEq,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>_>_>_>,_true>_>_>
             *)shapePartitions._M_h._M_bucket_count;
  while (this_03 !=
         (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_std::optional<wasm::HeapType>,_std::unordered_map<wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>,_wasm::(anonymous_namespace)::ShapeHash,_wasm::(anonymous_namespace)::ShapeEq,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>_>_>_>,_true>_>_>
          *)0x0) {
    p_Var6 = *(_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_std::optional<wasm::HeapType>,_std::unordered_map<wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>,_wasm::(anonymous_namespace)::ShapeHash,_wasm::(anonymous_namespace)::ShapeEq,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>_>_>_>,_true>_>_>
               **)this_03;
    std::__detail::
    _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_std::optional<wasm::HeapType>,_std::unordered_map<wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>,_wasm::(anonymous_namespace)::ShapeHash,_wasm::(anonymous_namespace)::ShapeEq,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>_>_>_>,_true>_>_>
    ::_M_deallocate_node(this_03,__n_00);
    this_03 = p_Var6;
  }
  memset(local_118,0,(long)shapePartitions._M_h._M_buckets << 3);
  shapePartitions._M_h._M_bucket_count = 0;
  shapePartitions._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  if (&shapePartitions._M_h._M_rehash_policy._M_next_resize != local_118) {
    operator_delete(local_118,(long)shapePartitions._M_h._M_buckets << 3);
  }
  std::
  _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_258);
  std::__cxx11::
  _List_base<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>,_std::allocator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>
  ::_M_clear((_List_base<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>,_std::allocator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>
              *)local_1f8);
  return bVar11;
}

Assistant:

bool TypeMerging::merge(MergeKind kind) {
  // Initial partitions are formed by grouping types with their structurally
  // similar supertypes or siblings, according to the `kind`.
  Partitions partitions;

#if TYPE_MERGING_DEBUG
  auto printedPrivateTypes = ModuleUtils::getPrivateHeapTypes(*module);
  using Fallback = IndexedTypeNameGenerator<DefaultTypeNameGenerator>;
  Fallback printPrivate(printedPrivateTypes, "private.");
  ModuleTypeNameGenerator<Fallback> print(*module, printPrivate);
  auto dumpPartitions = [&]() {
    size_t i = 0;
    for (auto& partition : partitions) {
      std::cerr << i++ << ": " << print(partition[0].val) << "\n";
      for (size_t j = 1; j < partition.size(); ++j) {
        std::cerr << "   " << print(partition[j].val) << "\n";
      }
      std::cerr << "\n";
    }
  };

#endif // TYPE_MERGING_DEBUG

  // Map each type to its partition in the list.
  std::unordered_map<HeapType, Partitions::iterator> typePartitions;

  // Map the supertypes and top-level structures of each type to partitions so
  // that siblings that refine the supertype in the same way can be assigned to
  // the same partition and potentially merged.
  std::unordered_map<
    std::optional<HeapType>,
    std::unordered_map<HeapType, Partitions::iterator, ShapeHash, ShapeEq>>
    shapePartitions;

  // Ensure the type has a partition and return a reference to it. Since we
  // merge up the type tree and visit supertypes first, the partition usually
  // already exists. The exception is when the supertype is public, in which
  // case we might not have created a partition for it yet.
  auto ensurePartition = [&](HeapType type) -> Partitions::iterator {
    auto [it, inserted] = typePartitions.insert({type, partitions.end()});
    if (inserted) {
      it->second = partitions.insert(partitions.end(), {makeDFAState(type)});
    }
    return it->second;
  };

  // Similar to the above, but look up or create a partition associated with the
  // type's supertype and top-level shape rather than its identity.
  auto ensureShapePartition = [&](HeapType type) -> Partitions::iterator {
    auto super = type.getDeclaredSuperType();
    if (super) {
      super = getMerged(*super);
    }
    auto [it, inserted] =
      shapePartitions[super].insert({type, partitions.end()});
    if (inserted) {
      it->second = partitions.insert(partitions.end(), Partition{});
    }
    return it->second;
  };

  // For each type, either create a new partition or add to its supertype's
  // partition.
  for (auto type : mergeableSupertypesFirst(mergeable)) {
    // We need partitions for any public children of this type since those
    // children will participate in the DFA we're creating.
    for (auto child : getPublicChildren(type)) {
      ensurePartition(child);
    }
    // If the type is distinguished by the module or public, we cannot merge it,
    // so create a new partition for it.
    if (castTypes.count(type) || !privateTypes.count(type)) {
      ensurePartition(type);
      continue;
    }

    switch (kind) {
      case Supertypes: {
        auto super = type.getDeclaredSuperType();
        if (super && shapeEq(type, *super)) {
          // The current type and its supertype have the same top-level
          // structure and are not distinguished, so add the current type to its
          // supertype's partition.
          auto it = ensurePartition(*super);
          it->push_back(makeDFAState(type));
          typePartitions[type] = it;
        } else {
          // Otherwise, create a new partition for this type.
          ensurePartition(type);
        }
        break;
      }
      case Siblings: {
        // Find or create a partition for this type's siblings of the same
        // shape.
        auto it = ensureShapePartition(type);
        it->push_back(makeDFAState(type));
        typePartitions[type] = it;
        break;
      }
    }
  }

#if TYPE_MERGING_DEBUG
  std::cerr << "Initial partitions (";
  switch (kind) {
    case Supertypes:
      std::cerr << "supertypes";
      break;
    case Siblings:
      std::cerr << "siblings";
      break;
  }
  std::cerr << "):\n";
  dumpPartitions();
#endif

  // Construct and refine the partitioned DFA.
  std::vector<Partition> dfa(std::make_move_iterator(partitions.begin()),
                             std::make_move_iterator(partitions.end()));
  auto refinedPartitions = DFA::refinePartitions(dfa);

#if TYPE_MERGING_DEBUG
  auto dumpRefinedPartitions = [&]() {
    size_t i = 0;
    for (auto& partition : refinedPartitions) {
      std::cerr << i++ << ": " << print(partition[0]) << "\n";
      for (size_t j = 1; j < partition.size(); ++j) {
        std::cerr << "   " << print(partition[j]) << "\n";
      }
      std::cerr << "\n";
    }
  };
  std::cerr << "Refined partitions:\n";
  dumpRefinedPartitions();
#endif

  if (kind == Supertypes) {
    // It's possible that a partition has been split such that a common ancestor
    // ended up in one of the new partitions, leaving unrelated types grouped
    // together in the other new partition. Since we are only supposed to be
    // merging types into their supertypes, merging such unrelated types would
    // be unsafe. Post-process the refined partitions to manually split any
    // partitions containing unrelated types.
    //
    // Normally splitting partitions like this would require re-running DFA
    // minimization afterward, but in this case it is not possible that the
    // manual splits cause types in any other partition to become
    // differentiatable. A type and its subtype cannot differ by referring to
    // different, unrelated types in the same position because then they would
    // not be in a valid subtype relationship.
    std::vector<std::vector<HeapType>> newPartitions;
    for (const auto& partitionTypes : refinedPartitions) {
      auto split = splitSupertypePartition(partitionTypes);
      newPartitions.insert(newPartitions.end(), split.begin(), split.end());
    }
    refinedPartitions = newPartitions;

#if TYPE_MERGING_DEBUG
    std::cerr << "Manually split partitions:\n";
    dumpRefinedPartitions();
#endif
  }

  // Merge each refined partition into a single type. We should only merge into
  // supertypes or siblings because if we try to merge into a subtype then we
  // will accidentally set that subtype to be its own supertype. Also keep track
  // of the remaining types.
  std::vector<HeapType> newMergeable;
  bool merged = false;
  for (const auto& partition : refinedPartitions) {
    auto target = mergeableSupertypesFirst(partition).front();
    newMergeable.push_back(target);
    for (auto type : partition) {
      if (type != target) {
        merges[type] = target;
        merged = true;
      }
    }
  }
  mergeable = std::move(newMergeable);

#if TYPE_MERGING_DEBUG
  std::cerr << "Merges:\n";
  std::unordered_map<HeapType, std::vector<HeapType>> mergees;
  for (auto& [mergee, target] : merges) {
    mergees[target].push_back(mergee);
  }
  for (auto& [target, types] : mergees) {
    std::cerr << "target: " << print(target) << "\n";
    for (auto type : types) {
      std::cerr << "  " << print(type) << "\n";
    }
    std::cerr << "\n";
  }
#endif // TYPE_MERGING_DEBUG

  return merged;
}